

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateWindowParentAndRootLinks
               (ImGuiWindow *window,ImGuiWindowFlags flags,ImGuiWindow *parent_window)

{
  ImGuiWindow *pIVar1;
  
  window->ParentWindow = parent_window;
  window->RootWindowForNav = window;
  window->RootWindowForTitleBarHighlight = window;
  window->RootWindowDockTree = window;
  window->RootWindowPopupTree = window;
  window->RootWindow = window;
  if ((((flags & 0x3000000U) == 0x1000000 && parent_window != (ImGuiWindow *)0x0) &&
      (window->RootWindowDockTree = parent_window->RootWindowDockTree,
      (window->field_0x3f9 & 1) == 0)) && ((parent_window->Flags & 0x20000000) == 0)) {
    window->RootWindow = parent_window->RootWindow;
  }
  if (((uint)flags >> 0x1a & 1) != 0 && parent_window != (ImGuiWindow *)0x0) {
    window->RootWindowPopupTree = parent_window->RootWindowPopupTree;
  }
  if (((parent_window != (ImGuiWindow *)0x0) && ((flags & 0x8000000U) == 0)) &&
     ((flags & 0x5000000U) != 0)) {
    window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
  }
  pIVar1 = window->RootWindowForNav;
  while( true ) {
    if ((pIVar1->Flags & 0x800000) == 0) {
      return;
    }
    pIVar1 = pIVar1->ParentWindow;
    if (pIVar1 == (ImGuiWindow *)0x0) break;
    window->RootWindowForNav = pIVar1;
  }
  __assert_fail("window->RootWindowForNav->ParentWindow != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                ,0x189d,
                "void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow *, ImGuiWindowFlags, ImGuiWindow *)"
               );
}

Assistant:

void ImGui::UpdateWindowParentAndRootLinks(ImGuiWindow* window, ImGuiWindowFlags flags, ImGuiWindow* parent_window)
{
    window->ParentWindow = parent_window;
    window->RootWindow = window->RootWindowPopupTree = window->RootWindowDockTree = window->RootWindowForTitleBarHighlight = window->RootWindowForNav = window;
    if (parent_window && (flags & ImGuiWindowFlags_ChildWindow) && !(flags & ImGuiWindowFlags_Tooltip))
    {
        window->RootWindowDockTree = parent_window->RootWindowDockTree;
        if (!window->DockIsActive && !(parent_window->Flags & ImGuiWindowFlags_DockNodeHost))
            window->RootWindow = parent_window->RootWindow;
    }
    if (parent_window && (flags & ImGuiWindowFlags_Popup))
        window->RootWindowPopupTree = parent_window->RootWindowPopupTree;
    if (parent_window && !(flags & ImGuiWindowFlags_Modal) && (flags & (ImGuiWindowFlags_ChildWindow | ImGuiWindowFlags_Popup)))
        window->RootWindowForTitleBarHighlight = parent_window->RootWindowForTitleBarHighlight;
    while (window->RootWindowForNav->Flags & ImGuiWindowFlags_NavFlattened)
    {
        IM_ASSERT(window->RootWindowForNav->ParentWindow != NULL);
        window->RootWindowForNav = window->RootWindowForNav->ParentWindow;
    }
}